

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O0

int xcb_input_feedback_state_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_feedback_state_data_t *_aux)

{
  uint uVar1;
  long in_RDX;
  char in_SIL;
  long *in_RDI;
  long in_FS_OFFSET;
  char *xcb_tmp;
  uint i;
  uint xcb_block_len;
  uint xcb_parts_idx;
  uint xcb_padding_offset;
  uint xcb_align_to;
  uint xcb_buffer_len;
  char *xcb_out;
  uint xcb_pad;
  char xcb_pad0 [3];
  iovec xcb_parts [27];
  void *local_200;
  uint local_1f8;
  int local_1f4;
  uint local_1f0;
  uint local_1e8;
  int local_1e4;
  void *local_1e0;
  uint local_1c0;
  undefined1 local_1bb [3];
  ulong local_1b8 [14];
  uint *puStack_148;
  undefined8 uStack_140;
  long lStack_138;
  undefined8 uStack_130;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_1e0 = (void *)*in_RDI;
  local_1e4 = 0;
  local_1c0 = 0;
  memset(local_1bb,0,3);
  memset(local_1b8,0xaa,0x1b0);
  local_1f0 = 0;
  local_1f4 = 0;
  if (in_SIL == '\0') {
    local_1b8[1] = 2;
    local_1b8[2] = in_RDX + 2;
    local_1b8[3] = 2;
    local_1b8[4] = in_RDX + 4;
    local_1b8[5] = 4;
    local_1b8[6] = in_RDX + 8;
    local_1b8[7] = 4;
    local_1b8[8] = in_RDX + 0xc;
    local_1b8[9] = 1;
    local_1b8[10] = in_RDX + 0xd;
    local_1b8[0xb] = 1;
    local_1b8[0xc] = in_RDX + 0xe;
    local_1b8[0xd] = 1;
    puStack_148 = &local_1c0;
    uStack_140 = 1;
    lStack_138 = in_RDX + 0x10;
    local_1f4 = 0x30;
    uStack_130 = 0x20;
    local_1f0 = 9;
  }
  local_1e8 = (uint)(in_SIL == '\0');
  if (in_SIL == '\x01') {
    local_1b8[(ulong)local_1f0 * 2] = (ulong)local_1bb;
    local_1b8[(ulong)local_1f0 * 2 + 1] = 2;
    local_1b8[(ulong)(local_1f0 + 1) * 2] = in_RDX + 0x32;
    local_1b8[(ulong)(local_1f0 + 1) * 2 + 1] = 2;
    local_1b8[(ulong)(local_1f0 + 2) * 2] = in_RDX + 0x34;
    local_1b8[(ulong)(local_1f0 + 2) * 2 + 1] = 2;
    local_1b8[(ulong)(local_1f0 + 3) * 2] = in_RDX + 0x36;
    local_1f4 = local_1f4 + 8;
    local_1b8[(ulong)(local_1f0 + 3) * 2 + 1] = 2;
    local_1f0 = local_1f0 + 4;
    local_1e8 = 2;
  }
  if (in_SIL == '\x02') {
    local_1b8[(ulong)local_1f0 * 2] = in_RDX + 0x38;
    local_1b8[(ulong)local_1f0 * 2 + 1] = 2;
    local_1b8[(ulong)(local_1f0 + 1) * 2] = in_RDX + 0x3a;
    local_1e4 = local_1f4 + 4;
    local_1b8[(ulong)(local_1f0 + 1) * 2 + 1] = 2;
    local_1b8[(ulong)(local_1f0 + 2) * 2] = *(ulong *)(in_RDX + 0x40);
    local_1f4 = (uint)*(ushort *)(in_RDX + 0x3a) * 4;
    local_1b8[(ulong)(local_1f0 + 2) * 2 + 1] = (ulong)*(ushort *)(in_RDX + 0x3a) << 2;
    local_1f0 = local_1f0 + 3;
    local_1e8 = 4;
  }
  if (in_SIL == '\x03') {
    local_1b8[(ulong)local_1f0 * 2] = in_RDX + 0x48;
    local_1b8[(ulong)local_1f0 * 2 + 1] = 4;
    local_1b8[(ulong)(local_1f0 + 1) * 2] = in_RDX + 0x4c;
    local_1b8[(ulong)(local_1f0 + 1) * 2 + 1] = 4;
    local_1b8[(ulong)(local_1f0 + 2) * 2] = in_RDX + 0x50;
    local_1f4 = local_1f4 + 0xc;
    local_1b8[(ulong)(local_1f0 + 2) * 2 + 1] = 4;
    local_1f0 = local_1f0 + 3;
    local_1e8 = 4;
  }
  if (in_SIL == '\x04') {
    local_1b8[(ulong)local_1f0 * 2] = in_RDX + 0x54;
    local_1b8[(ulong)local_1f0 * 2 + 1] = 4;
    local_1b8[(ulong)(local_1f0 + 1) * 2] = in_RDX + 0x58;
    local_1f4 = local_1f4 + 8;
    local_1b8[(ulong)(local_1f0 + 1) * 2 + 1] = 4;
    local_1f0 = local_1f0 + 2;
    local_1e8 = 4;
  }
  if (in_SIL == '\x05') {
    local_1b8[(ulong)local_1f0 * 2] = in_RDX + 0x5c;
    local_1b8[(ulong)local_1f0 * 2 + 1] = 1;
    local_1b8[(ulong)(local_1f0 + 1) * 2] = (ulong)local_1bb;
    local_1b8[(ulong)(local_1f0 + 1) * 2 + 1] = 3;
    local_1b8[(ulong)(local_1f0 + 2) * 2] = in_RDX + 0x60;
    local_1b8[(ulong)(local_1f0 + 2) * 2 + 1] = 2;
    local_1b8[(ulong)(local_1f0 + 3) * 2] = in_RDX + 0x62;
    local_1f4 = local_1f4 + 8;
    local_1b8[(ulong)(local_1f0 + 3) * 2 + 1] = 2;
    local_1f0 = local_1f0 + 4;
    local_1e8 = 2;
  }
  local_1c0 = -local_1f4 & local_1e8 - 1;
  uVar1 = local_1f4 + local_1c0 + local_1e4;
  if (local_1c0 != 0) {
    local_1b8[(ulong)local_1f0 * 2] = (ulong)local_1bb;
    local_1b8[(ulong)local_1f0 * 2 + 1] = (ulong)local_1c0;
    local_1f0 = local_1f0 + 1;
    local_1c0 = 0;
  }
  if (local_1e0 == (void *)0x0) {
    local_1e0 = malloc((ulong)uVar1);
    *in_RDI = (long)local_1e0;
  }
  local_200 = local_1e0;
  for (local_1f8 = 0; local_1f8 < local_1f0; local_1f8 = local_1f8 + 1) {
    if ((local_1b8[(ulong)local_1f8 * 2] != 0) && (local_1b8[(ulong)local_1f8 * 2 + 1] != 0)) {
      memcpy(local_200,(void *)local_1b8[(ulong)local_1f8 * 2],local_1b8[(ulong)local_1f8 * 2 + 1]);
    }
    if (local_1b8[(ulong)local_1f8 * 2 + 1] != 0) {
      local_200 = (void *)(local_1b8[(ulong)local_1f8 * 2 + 1] + (long)local_200);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

int
xcb_input_feedback_state_data_serialize (void                                  **_buffer,
                                         uint8_t                                 class_id,
                                         const xcb_input_feedback_state_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[27];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_FEEDBACK_CLASS_KEYBOARD) {
        /* xcb_input_feedback_state_data_t.keyboard.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.pitch;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.keyboard.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.duration;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.keyboard.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.keyboard.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.keyboard.global_auto_repeat */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.global_auto_repeat;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.click */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.click;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.percent;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.keyboard.auto_repeats */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->keyboard.auto_repeats;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_POINTER) {
        /* xcb_input_feedback_state_data_t.pointer.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.pointer.accel_num */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.accel_num;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.pointer.accel_denom */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.accel_denom;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.pointer.threshold */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.threshold;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_STRING) {
        /* xcb_input_feedback_state_data_t.string.max_symbols */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.max_symbols;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.string.num_keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.num_keysyms;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->string.keysyms;
        xcb_block_len += _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_keysym_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_INTEGER) {
        /* xcb_input_feedback_state_data_t.integer.resolution */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.resolution;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.integer.min_value */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.min_value;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
        /* xcb_input_feedback_state_data_t.integer.max_value */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.max_value;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_LED) {
        /* xcb_input_feedback_state_data_t.led.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_state_data_t.led.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_BELL) {
        /* xcb_input_feedback_state_data_t.bell.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.percent;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.bell.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*3;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*3;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_state_data_t.bell.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.pitch;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* xcb_input_feedback_state_data_t.bell.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.duration;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}